

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall
TasGrid::GridFourier::updateGrid
          (GridFourier *this,int depth,TypeDepth type,
          vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  bool bVar1;
  undefined1 local_88 [8];
  MultiIndexSet new_tensors;
  MultiIndexSet local_50;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *level_limits_local;
  vector<int,_std::allocator<int>_> *anisotropic_weights_local;
  TypeDepth type_local;
  int depth_local;
  GridFourier *this_local;
  
  local_28 = level_limits;
  level_limits_local = anisotropic_weights;
  anisotropic_weights_local._0_4_ = type;
  anisotropic_weights_local._4_4_ = depth;
  _type_local = this;
  if (((this->super_BaseCanonicalGrid).num_outputs != 0) &&
     (bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points), !bVar1)) {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
    selectTensors(&local_50,this,(long)(this->super_BaseCanonicalGrid).num_dimensions,
                  anisotropic_weights_local._4_4_,(TypeDepth)anisotropic_weights_local,
                  level_limits_local,local_28);
    MultiIndexSet::operator=(&this->updated_tensors,&local_50);
    MultiIndexSet::~MultiIndexSet(&local_50);
    MultiIndexSet::operator-((MultiIndexSet *)local_88,&this->updated_tensors,&this->tensors);
    bVar1 = MultiIndexSet::empty((MultiIndexSet *)local_88);
    if (!bVar1) {
      MultiIndexSet::operator+=(&this->updated_tensors,&this->tensors);
      proposeUpdatedTensors(this);
    }
    MultiIndexSet::~MultiIndexSet((MultiIndexSet *)local_88);
    return;
  }
  makeGrid(this,(this->super_BaseCanonicalGrid).num_dimensions,
           (this->super_BaseCanonicalGrid).num_outputs,anisotropic_weights_local._4_4_,
           (TypeDepth)anisotropic_weights_local,level_limits_local,local_28);
  return;
}

Assistant:

void GridFourier::updateGrid(int depth, TypeDepth type, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    if ((num_outputs == 0) || points.empty()){
        makeGrid(num_dimensions, num_outputs, depth, type, anisotropic_weights, level_limits);
    }else{
        clearRefinement();

        updated_tensors = selectTensors((size_t) num_dimensions, depth, type, anisotropic_weights, level_limits);

        MultiIndexSet new_tensors = updated_tensors - tensors;

        if (!new_tensors.empty()){
            updated_tensors += tensors;
            proposeUpdatedTensors();
        }
    }
}